

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

pool_ptr<soul::AST::Function> __thiscall soul::AST::Block::getParentFunction(Block *this)

{
  long *plVar1;
  long in_RSI;
  
  if (*(_func_int ***)(in_RSI + 0x30) == (_func_int **)0x0) {
    plVar1 = (long *)(**(code **)(*(long *)(in_RSI + 0x28) + 0x20))(in_RSI + 0x28);
    if (plVar1 == (long *)0x0) {
      (this->super_Statement).super_ASTObject._vptr_ASTObject = (_func_int **)0x0;
    }
    else {
      (**(code **)(*plVar1 + 0x58))(this,plVar1);
    }
  }
  else {
    (this->super_Statement).super_ASTObject._vptr_ASTObject = *(_func_int ***)(in_RSI + 0x30);
  }
  return (pool_ptr<soul::AST::Function>)(Function *)this;
}

Assistant:

pool_ptr<Function> getParentFunction() const override
        {
            if (isFunctionMainBlock())
                return functionForWhichThisIsMain;

            return Scope::getParentFunction();
        }